

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEngine::emitReadNotification(QHttpSocketEngine *this)

{
  QHttpSocketEnginePrivate *pQVar1;
  undefined8 in_RDI;
  ConnectionType c;
  char *unaff_retaddr;
  QHttpSocketEnginePrivate *d;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QHttpSocketEngine *)0x339bbb);
  if ((((pQVar1->readNotificationEnabled & 1U) != 0) &&
      ((pQVar1->readNotificationPending & 1U) == 0)) ||
     ((pQVar1->connectionNotificationPending & 1U) != 0)) {
    pQVar1->readNotificationPending = true;
    QMetaObject::invokeMethod<>((QObject *)d,unaff_retaddr,c);
  }
  return;
}

Assistant:

void QHttpSocketEngine::emitReadNotification()
{
    Q_D(QHttpSocketEngine);
    // if there is a connection notification pending we have to emit the readNotification
    // in case there is connection error. This is only needed for Windows, but it does not
    // hurt in other cases.
    if ((d->readNotificationEnabled && !d->readNotificationPending) || d->connectionNotificationPending) {
        d->readNotificationPending = true;
        QMetaObject::invokeMethod(this, "emitPendingReadNotification", Qt::QueuedConnection);
    }
}